

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateDesiredPoint
          (L2NormCost *this,VectorDynSize *desiredPoint)

{
  L2NormCostImplementation *pLVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> newTrajectory;
  undefined1 local_39;
  TimeInvariantObject<iDynTree::VectorDynSize> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  TimeInvariantObject<iDynTree::VectorDynSize> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((this->m_pimpl->stateCost).m_valid == false) {
    pcVar4 = "The state cost portion has been deactivated, given the provided selectors.";
  }
  else {
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = iDynTree::VectorDynSize::size();
    if (uVar3 == uVar2) {
      local_28 = (TimeInvariantObject<iDynTree::VectorDynSize> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>>,iDynTree::VectorDynSize_const&>
                (&local_20,&local_28,
                 (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                  *)&local_39,desiredPoint);
      pLVar1 = this->m_pimpl;
      local_38 = local_28;
      local_30._M_pi = local_20._M_pi;
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        }
      }
      (pLVar1->stateCost).desiredTrajectory.
      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = &local_28->super_TimeVaryingObject<iDynTree::VectorDynSize>;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pLVar1->stateCost).desiredTrajectory.
                  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_30);
      if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
      }
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
      }
      return true;
    }
    pcVar4 = "The desiredPoint size do not match the dimension of the specified selector.";
  }
  iDynTree::reportError("L2NormCost","setStateDesiredPoint",pcVar4);
  return false;
}

Assistant:

bool L2NormCost::setStateDesiredPoint(const VectorDynSize &desiredPoint)
        {
            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateDesiredPoint", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (desiredPoint.size() != (m_pimpl->stateCost.selector->size())) {
                reportError("L2NormCost", "setStateDesiredPoint", "The desiredPoint size do not match the dimension of the specified selector.");
                return false;
            }

            std::shared_ptr<TimeInvariantVector> newTrajectory = std::make_shared<TimeInvariantVector>(desiredPoint);
            return m_pimpl->stateCost.setDesiredTrajectory(newTrajectory);
        }